

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::DtlsSession::Write
          (Error *__return_storage_ptr__,DtlsSession *this,ByteArray *aBuf,MessageSubType aSubType)

{
  char cVar1;
  uchar *buf;
  pointer puVar2;
  pointer puVar3;
  uint aMbedtlsError;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *aBytes;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  writer write;
  string local_e8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [8];
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  pointer local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pfStack_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  local_80 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_80;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if (this->mState == kConnected) {
    ((this->mSocket).super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->mSubType = aSubType;
    buf = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
    aMbedtlsError =
         mbedtls_ssl_write(&this->mSsl,buf,
                           (long)(aBuf->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)buf);
    ((this->mSocket).super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->mSubType = kNone;
    if ((int)aMbedtlsError < 0) {
      ErrorFromMbedtlsError((Error *)local_78,aMbedtlsError);
      __return_storage_ptr__->mCode = local_78._0_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->mMessage,(string *)&local_70);
      paVar5 = &local_60;
      local_e8._M_dataplus._M_p = local_70._M_p;
      goto LAB_001baa70;
    }
    if ((DtlsSession *)
        ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish +
        -(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start) == (DtlsSession *)(ulong)aMbedtlsError) {
      local_a8 = (undefined1  [8])&local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"dtls","");
      local_78 = (undefined1  [8])0x40000000e;
      local_70._M_p._0_4_ = 0xd;
      pcVar4 = "session(={}) successfully write data: len={}, {}";
      local_68 = "session(={}) successfully write data: len={}, {}";
      local_60._M_allocated_capacity = 0x30;
      local_60._8_8_ = 0x300000000;
      local_48 = ::fmt::v10::detail::
                 parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      pcStack_40 = ::fmt::v10::detail::
                   parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      local_38 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_c8._0_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_78;
      pfStack_50 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_78;
      do {
        cVar1 = *pcVar4;
        pcVar6 = pcVar4;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_c8,pcVar4,"");
            aBytes = extraout_RDX_00;
            goto LAB_001baaa3;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)local_c8,pcVar4,pcVar6);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,unsigned_long,std::__cxx11::string>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_78);
        aBytes = extraout_RDX;
      } while (pcVar4 != "");
LAB_001baaa3:
      puVar2 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      utils::Hex_abi_cxx11_((string *)local_c8,(utils *)aBuf,aBytes);
      local_68 = puVar3 + -(long)puVar2;
      local_60._8_8_ = local_c8._0_8_;
      pfStack_50 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_c8._8_8_;
      fmt_00.size_ = 0xd4e;
      fmt_00.data_ = (char *)0x30;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_78;
      local_78 = (undefined1  [8])this;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e8,(v10 *)"session(={}) successfully write data: len={}, {}",fmt_00,args_01)
      ;
      Log(kDebug,(string *)local_a8,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_c8._0_8_ !=
          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_);
      }
      paVar5 = &local_98;
      local_e8._M_dataplus._M_p = (pointer)local_a8;
      goto LAB_001baa70;
    }
    local_78 = (undefined1  [8])0x400000001;
    pcVar4 = "written {} bytes of total length {}";
    local_70._M_p = "written {} bytes of total length {}";
    local_68 = (pointer)0x23;
    local_60._M_allocated_capacity = 0x200000000;
    pfStack_50 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)::fmt::v10::detail::
                    parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_c8._0_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_78;
    local_60._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_78;
    do {
      cVar1 = *pcVar4;
      pcVar6 = pcVar4;
      while (cVar1 != '{') {
        pcVar6 = pcVar6 + 1;
        if (pcVar6 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
          ::writer::operator()((writer *)local_c8,pcVar4,"");
          goto LAB_001ba9e6;
        }
        cVar1 = *pcVar6;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
      ::writer::operator()((writer *)local_c8,pcVar4,pcVar6);
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int,unsigned_long>&>
                         (pcVar6,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_78);
    } while (pcVar4 != "");
LAB_001ba9e6:
    local_68 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
    fmt.size_ = 0x41;
    fmt.data_ = (char *)0x23;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_78;
    local_78 = (undefined1  [8])(ulong)aMbedtlsError;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_e8,(v10 *)"written {} bytes of total length {}",fmt,args_00);
    local_a8._0_4_ = 0xc;
    local_a0 = local_98._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,local_e8._M_dataplus._M_p,
               local_e8._M_dataplus._M_p + local_e8._M_string_length);
    __return_storage_ptr__->mCode = local_a8._0_4_;
  }
  else {
    local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
    pcVar4 = "the DTLS session is not connected";
    local_70._M_p = "the DTLS session is not connected";
    local_68 = (pointer)0x21;
    local_60._M_allocated_capacity = 0;
    pfStack_50 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x0;
    local_c8._0_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_78;
    local_60._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_78;
    do {
      cVar1 = *pcVar4;
      pcVar6 = pcVar4;
      while (cVar1 != '{') {
        pcVar6 = pcVar6 + 1;
        if (pcVar6 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_c8,pcVar4,"");
          goto LAB_001ba899;
        }
        cVar1 = *pcVar6;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()((writer *)local_c8,pcVar4,pcVar6);
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar6,"",(format_string_checker<char> *)local_78);
    } while (pcVar4 != "");
LAB_001ba899:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_78;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_e8,(v10 *)"the DTLS session is not connected",(string_view)ZEXT816(0x21),args)
    ;
    local_a8._0_4_ = 0xf;
    local_a0 = local_98._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,local_e8._M_dataplus._M_p,
               local_e8._M_dataplus._M_p + local_e8._M_string_length);
    __return_storage_ptr__->mCode = local_a8._0_4_;
  }
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_a0);
  if (local_a0 != local_98._M_local_buf + 8) {
    operator_delete(local_a0);
  }
  paVar5 = &local_e8.field_2;
LAB_001baa70:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar5) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Write(const ByteArray &aBuf, MessageSubType aSubType)
{
    int   rval = 0;
    Error error;

    VerifyOrExit(mState == State::kConnected, error = ERROR_INVALID_STATE("the DTLS session is not connected"));

    mSocket->SetSubType(aSubType);
    rval = mbedtls_ssl_write(&mSsl, &aBuf[0], aBuf.size());
    mSocket->SetSubType(MessageSubType::kNone);

    if (rval >= 0)
    {
        VerifyOrExit(static_cast<size_t>(rval) == aBuf.size(),
                     error = ERROR_IO_BUSY("written {} bytes of total length {}", rval, aBuf.size()));

        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) successfully write data: len={}, {}", static_cast<void *>(this),
                  aBuf.size(), utils::Hex(aBuf));
    }
    else
    {
        error = ErrorFromMbedtlsError(rval);
    }

exit:
    return error;
}